

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int MMDB_aget_value(MMDB_entry_s *start,MMDB_entry_data_s *entry_data,char **path)

{
  uint32_t uVar1;
  MMDB_s *mmdb;
  MMDB_entry_data_s *pMVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  MMDB_entry_data_s *pMVar7;
  MMDB_entry_data_s *pMVar8;
  char *__s;
  uint32_t uVar9;
  bool bVar10;
  MMDB_entry_data_s key;
  char *first_invalid;
  MMDB_entry_data_s local_b8;
  char **local_80;
  long local_78;
  size_t local_70;
  MMDB_entry_data_s local_68;
  
  mmdb = start->mmdb;
  uVar9 = start->offset;
  entry_data->offset = 0;
  entry_data->offset_to_next = 0;
  entry_data->data_size = 0;
  entry_data->type = 0;
  (entry_data->field_1).utf8_string = (char *)0x0;
  *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
  *(undefined8 *)entry_data = 0;
  *(undefined8 *)&entry_data->field_0x8 = 0;
  iVar3 = decode_one_follow(mmdb,uVar9,entry_data);
  if ((iVar3 == 0) && (iVar3 = 8, entry_data->has_data == true)) {
    __s = *path;
    if (__s != (char *)0x0) {
      local_78 = 1;
      local_80 = path;
      do {
        if (entry_data->type == 7) {
          uVar9 = entry_data->offset_to_next;
          uVar1 = entry_data->data_size;
          local_70 = strlen(__s);
          iVar3 = uVar1 + 1;
          do {
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) {
              entry_data->offset = 0;
              entry_data->offset_to_next = 0;
              entry_data->data_size = 0;
              entry_data->type = 0;
              (entry_data->field_1).utf8_string = (char *)0x0;
              *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
              *(undefined8 *)entry_data = 0;
              *(undefined8 *)&entry_data->field_0x8 = 0;
              path = (char **)0x9;
              break;
            }
            uVar4 = decode_one_follow(mmdb,uVar9,&local_b8);
            uVar1 = local_b8.offset_to_next;
            if (uVar4 == 0) {
              if (local_b8.type != 2) {
                path = (char **)0x7;
                goto LAB_001028a9;
              }
              if ((local_70 == local_b8.data_size) &&
                 (iVar5 = bcmp(__s,local_b8.field_1.utf8_string,local_70), iVar5 == 0)) {
                uVar4 = decode_one_follow(mmdb,uVar1,&local_68);
                if (uVar4 == 0) {
                  entry_data->offset = local_68.offset;
                  entry_data->offset_to_next = local_68.offset_to_next;
                  entry_data->data_size = local_68.data_size;
                  entry_data->type = local_68.type;
                  (entry_data->field_1).utf8_string = local_68.field_1.utf8_string;
                  *(undefined8 *)((long)&entry_data->field_1 + 8) = local_68.field_1.uint128._8_8_;
                  entry_data->has_data = local_68.has_data;
                  *(undefined7 *)&entry_data->field_0x1 = local_68._1_7_;
                  *(undefined8 *)&entry_data->field_0x8 = local_68._8_8_;
                  path = (char **)0x0;
                }
                else {
                  path = (char **)(ulong)uVar4;
                }
LAB_0010289d:
                bVar10 = false;
              }
              else {
                uVar4 = decode_one(mmdb,uVar1,&local_68);
                if (uVar4 != 0) {
                  path = (char **)(ulong)uVar4;
                  goto LAB_0010289d;
                }
                uVar4 = skip_map_or_array(mmdb,&local_68);
                bVar10 = uVar4 == 0;
                if (bVar10) {
                  uVar9 = local_68.offset_to_next;
                  uVar4 = (uint)path;
                }
                path = (char **)(ulong)uVar4;
              }
            }
            else {
              path = (char **)(ulong)uVar4;
LAB_001028a9:
              bVar10 = false;
            }
          } while (bVar10);
          if ((int)path != 0) {
            entry_data->offset = 0;
            entry_data->offset_to_next = 0;
            entry_data->data_size = 0;
            entry_data->type = 0;
            (entry_data->field_1).utf8_string = (char *)0x0;
            *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
            *(undefined8 *)entry_data = 0;
            *(undefined8 *)&entry_data->field_0x8 = 0;
            return (int)path;
          }
        }
        else {
          if (entry_data->type != 0xb) {
            entry_data->offset = 0;
            entry_data->offset_to_next = 0;
            entry_data->data_size = 0;
            entry_data->type = 0;
            (entry_data->field_1).utf8_string = (char *)0x0;
            *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
            *(undefined8 *)entry_data = 0;
            *(undefined8 *)&entry_data->field_0x8 = 0;
            return 9;
          }
          uVar4 = entry_data->data_size;
          path = (char **)(ulong)uVar4;
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          *piVar6 = 0;
          pMVar7 = (MMDB_entry_data_s *)strtol(__s,(char **)&local_68,10);
          iVar5 = *piVar6;
          *piVar6 = iVar3;
          iVar3 = 8;
          if (iVar5 != 0x22) {
            if (((long)pMVar7 < 0) &&
               (pMVar7 = (MMDB_entry_data_s *)
                         (&((MMDB_entry_data_s *)path)->has_data + (long)&pMVar7->has_data),
               (long)pMVar7 < 0)) {
              iVar3 = 9;
            }
            else {
              iVar3 = 9;
              if ((*(char *)local_68._0_8_ == '\0') && (pMVar7 < path)) {
                path = (char **)(ulong)CONCAT31((int3)(uVar4 >> 8),
                                                pMVar7 != (MMDB_entry_data_s *)0x0);
                iVar3 = 9;
                if (((pMVar7 != (MMDB_entry_data_s *)0x0) &&
                    (iVar5 = decode_one(mmdb,entry_data->offset_to_next,entry_data), iVar3 = iVar5,
                    iVar5 == 0)) && (iVar3 = skip_map_or_array(mmdb,entry_data), iVar3 == 0)) {
                  pMVar2 = (MMDB_entry_data_s *)0x1;
                  do {
                    pMVar8 = pMVar2;
                    iVar3 = iVar5;
                    if ((pMVar7 == pMVar8) ||
                       (iVar3 = decode_one(mmdb,entry_data->offset_to_next,entry_data), iVar3 != 0))
                    break;
                    iVar3 = skip_map_or_array(mmdb,entry_data);
                    pMVar2 = (MMDB_entry_data_s *)&pMVar8->field_0x1;
                  } while (iVar3 == 0);
                  path = (char **)CONCAT71((int7)((ulong)pMVar8 >> 8),pMVar8 < pMVar7);
                }
                if (((char)path == '\0') &&
                   (iVar3 = decode_one_follow(mmdb,entry_data->offset_to_next,&local_b8),
                   path = (char **)entry_data, iVar3 == 0)) {
                  entry_data->offset = local_b8.offset;
                  entry_data->offset_to_next = local_b8.offset_to_next;
                  entry_data->data_size = local_b8.data_size;
                  entry_data->type = local_b8.type;
                  (entry_data->field_1).utf8_string = local_b8.field_1.utf8_string;
                  *(undefined8 *)((long)&entry_data->field_1 + 8) = local_b8.field_1.uint128._8_8_;
                  entry_data->has_data = local_b8.has_data;
                  *(undefined7 *)&entry_data->field_0x1 = local_b8._1_7_;
                  *(undefined8 *)&entry_data->field_0x8 = local_b8._8_8_;
                  iVar3 = 0;
                }
              }
            }
          }
          if (iVar3 != 0) {
            entry_data->offset = 0;
            entry_data->offset_to_next = 0;
            entry_data->data_size = 0;
            entry_data->type = 0;
            (entry_data->field_1).utf8_string = (char *)0x0;
            *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
            *(undefined8 *)entry_data = 0;
            *(undefined8 *)&entry_data->field_0x8 = 0;
            return iVar3;
          }
        }
        __s = local_80[local_78];
        local_78 = local_78 + 1;
      } while (__s != (char *)0x0);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int MMDB_aget_value(MMDB_entry_s *const start,
                    MMDB_entry_data_s *const entry_data,
                    const char *const *const path) {
    const MMDB_s *const mmdb = start->mmdb;
    uint32_t offset = start->offset;

    memset(entry_data, 0, sizeof(MMDB_entry_data_s));
    DEBUG_NL;
    DEBUG_MSG("looking up value by path");

    CHECKED_DECODE_ONE_FOLLOW(mmdb, offset, entry_data);

    DEBUG_NL;
    DEBUG_MSGF("top level element is a %s", type_num_to_name(entry_data->type));

    /* Can this happen? It'd probably represent a pathological case under
     * normal use, but there's nothing preventing someone from passing an
     * invalid MMDB_entry_s struct to this function */
    if (!entry_data->has_data) {
        return MMDB_INVALID_LOOKUP_PATH_ERROR;
    }

    const char *path_elem;
    int i = 0;
    while (NULL != (path_elem = path[i++])) {
        DEBUG_NL;
        DEBUG_MSGF("path elem = %s", path_elem);

        /* XXX - it'd be good to find a quicker way to skip through these
           entries that doesn't involve decoding them
           completely. Basically we need to just use the size from the
           control byte to advance our pointer rather than calling
           decode_one(). */
        if (entry_data->type == MMDB_DATA_TYPE_ARRAY) {
            int status = lookup_path_in_array(path_elem, mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                memset(entry_data, 0, sizeof(MMDB_entry_data_s));
                return status;
            }
        } else if (entry_data->type == MMDB_DATA_TYPE_MAP) {
            int status = lookup_path_in_map(path_elem, mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                memset(entry_data, 0, sizeof(MMDB_entry_data_s));
                return status;
            }
        } else {
            /* Once we make the code traverse maps & arrays without calling
             * decode_one() we can get rid of this. */
            memset(entry_data, 0, sizeof(MMDB_entry_data_s));
            return MMDB_LOOKUP_PATH_DOES_NOT_MATCH_DATA_ERROR;
        }
    }

    return MMDB_SUCCESS;
}